

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,anon_class_8_1_8991fb9c comp,int bad_allowed,bool leftmost)

{
  int iVar1;
  pair<int,_int> pVar2;
  pair<int,_int> *ppVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var8;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var9;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
  _Var10;
  pair<int,_int> *nz2;
  pair<int,_int> *ppVar11;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var12;
  ulong uVar13;
  pair<int,_int> *ppVar14;
  pair<int,_int> local_90;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_presolve_HPresolve_cpp:4999:7)>
  __cmp;
  int local_7c;
  anon_class_8_1_8991fb9c local_68;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_60;
  _DistanceType __len;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_50;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_48;
  long local_40;
  anon_class_8_1_8991fb9c comp_local;
  
  local_60._M_current = end._M_current + -1;
  local_48._M_current = end._M_current + -2;
  local_50._M_current = end._M_current + -3;
  __cmp._M_comp.this = (anon_class_8_1_8991fb9c)(anon_class_8_1_8991fb9c)comp.this;
  comp_local.this = comp.this;
  local_7c = bad_allowed;
LAB_0031358b:
  do {
    _Var10._M_comp.this = __cmp._M_comp.this;
    lVar5 = (long)end._M_current - (long)begin._M_current;
    uVar6 = lVar5 >> 3;
    if ((long)uVar6 < 0x18) {
      if ((leftmost & 1U) == 0) {
        local_68 = __cmp._M_comp.this;
        if (begin._M_current != end._M_current) {
          ppVar11 = begin._M_current + -1;
          while (ppVar14 = begin._M_current + 1, ppVar14 != end._M_current) {
            bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                              (&local_68,ppVar14,begin._M_current);
            if (bVar4) {
              local_90 = *ppVar14;
              ppVar3 = ppVar11;
              do {
                nz2 = ppVar3;
                nz2[2] = nz2[1];
                bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                                  (&local_68,&local_90,nz2);
                ppVar3 = nz2 + -1;
              } while (bVar4);
              nz2[1].first = local_90.first;
              nz2[1].second = local_90.second;
            }
            ppVar11 = ppVar11 + 1;
            begin._M_current = ppVar14;
          }
        }
      }
      else {
        local_68 = __cmp._M_comp.this;
        if (begin._M_current != end._M_current) {
          _Var10._M_comp.this = (anon_class_8_1_8991fb9c)(HPresolve *)0x0;
          _Var8._M_current = begin._M_current;
          while (ppVar11 = _Var8._M_current + 1, ppVar11 != end._M_current) {
            bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                              (&local_68,ppVar11,_Var8._M_current);
            if (bVar4) {
              local_90 = *ppVar11;
              _Var8._M_current = ppVar11;
              __cmp._M_comp.this = _Var10._M_comp.this;
              do {
                ppVar14 = _Var8._M_current;
                *ppVar14 = ppVar14[-1];
                _Var8._M_current = begin._M_current;
                if (_Var10._M_comp.this == (HPresolve *)0x0) break;
                _Var8._M_current = ppVar14 + -1;
                bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                                  (&local_68,&local_90,ppVar14 + -2);
                _Var10._M_comp.this =
                     (anon_class_8_1_8991fb9c)&((HPresolve *)_Var10._M_comp.this)->options;
              } while (bVar4);
              (_Var8._M_current)->first = local_90.first;
              ppVar14[-1].second = local_90.second;
              _Var10._M_comp.this = __cmp._M_comp.this;
            }
            _Var10._M_comp.this =
                 (anon_class_8_1_8991fb9c)
                 &(((HPresolve *)((long)_Var10._M_comp.this + -0x6b8))->analysis_).presolve_log_.
                  rule.
                  super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
            _Var8._M_current = ppVar11;
          }
        }
      }
      return;
    }
    uVar13 = uVar6 >> 1;
    _Var8._M_current = begin._M_current + uVar13;
    __len = uVar6;
    local_40 = lVar5;
    if (uVar6 < 0x81) {
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (_Var8,begin,local_60,__cmp._M_comp.this);
    }
    else {
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin,_Var8,local_60,__cmp._M_comp.this);
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin._M_current + 1,begin._M_current + (uVar13 - 1),local_48,_Var10._M_comp.this);
      ppVar11 = begin._M_current + uVar13;
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin._M_current + 2,ppVar11 + 1,local_50,_Var10._M_comp.this);
      sort3<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                (begin._M_current + (uVar13 - 1),_Var8,ppVar11 + 1,_Var10._M_comp.this);
      pVar2 = *begin._M_current;
      *begin._M_current = *ppVar11;
      *ppVar11 = pVar2;
    }
    if (((leftmost & 1U) == 0) &&
       (bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&comp_local,begin._M_current + -1,begin._M_current), !bVar4)) {
      local_68 = __cmp._M_comp.this;
      local_90 = *begin._M_current;
      lVar5 = -8;
      _Var8._M_current = end._M_current;
      do {
        _Var8._M_current = _Var8._M_current + -1;
        bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&local_68,&local_90,_Var8._M_current);
        lVar5 = lVar5 + 8;
      } while (bVar4);
      _Var9._M_current = begin._M_current;
      if (lVar5 == 0) {
        do {
          if (_Var8._M_current <= _Var9._M_current) break;
          _Var9._M_current = _Var9._M_current + 1;
          bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (&local_68,&local_90,_Var9._M_current);
        } while (!bVar4);
      }
      else {
        do {
          _Var9._M_current = _Var9._M_current + 1;
          bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (&local_68,&local_90,_Var9._M_current);
        } while (!bVar4);
      }
      while (_Var9._M_current < _Var8._M_current) {
        iVar1 = (_Var9._M_current)->first;
        (_Var9._M_current)->first = (_Var8._M_current)->first;
        (_Var8._M_current)->first = iVar1;
        iVar1 = (_Var9._M_current)->second;
        (_Var9._M_current)->second = (_Var8._M_current)->second;
        (_Var8._M_current)->second = iVar1;
        do {
          _Var8._M_current = _Var8._M_current + -1;
          bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (&local_68,&local_90,_Var8._M_current);
        } while (bVar4);
        do {
          _Var9._M_current = _Var9._M_current + 1;
          bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (&local_68,&local_90,_Var9._M_current);
        } while (!bVar4);
      }
      (begin._M_current)->first = (_Var8._M_current)->first;
      (begin._M_current)->second = (_Var8._M_current)->second;
      (_Var8._M_current)->first = local_90.first;
      (_Var8._M_current)->second = local_90.second;
      begin._M_current = _Var8._M_current + 1;
      goto LAB_0031358b;
    }
    local_68 = __cmp._M_comp.this;
    local_90 = *begin._M_current;
    lVar5 = 8;
    _Var8._M_current = begin._M_current;
    do {
      _Var8._M_current = _Var8._M_current + 1;
      bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                        (&local_68,_Var8._M_current,&local_90);
      lVar5 = lVar5 + -8;
    } while (bVar4);
    _Var9._M_current = end._M_current;
    _Var12._M_current = _Var8._M_current;
    if (lVar5 == 0) {
      do {
        ppVar11 = _Var9._M_current;
        if (_Var9._M_current <= _Var8._M_current) break;
        _Var9._M_current = _Var9._M_current + -1;
        bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&local_68,_Var9._M_current,&local_90);
        ppVar11 = _Var9._M_current;
      } while (!bVar4);
    }
    else {
      do {
        _Var9._M_current = _Var9._M_current + -1;
        bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&local_68,_Var9._M_current,&local_90);
        ppVar11 = _Var9._M_current;
      } while (!bVar4);
    }
    while (_Var10._M_comp.this = __cmp._M_comp.this, _Var12._M_current < _Var9._M_current) {
      iVar1 = (_Var12._M_current)->first;
      (_Var12._M_current)->first = (_Var9._M_current)->first;
      (_Var9._M_current)->first = iVar1;
      iVar1 = (_Var12._M_current)->second;
      (_Var12._M_current)->second = (_Var9._M_current)->second;
      (_Var9._M_current)->second = iVar1;
      do {
        _Var12._M_current = _Var12._M_current + 1;
        bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&local_68,_Var12._M_current,&local_90);
      } while (bVar4);
      do {
        _Var9._M_current = _Var9._M_current + -1;
        bVar4 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (&local_68,_Var9._M_current,&local_90);
      } while (!bVar4);
    }
    _Var9._M_current = _Var12._M_current + -1;
    (begin._M_current)->first = _Var12._M_current[-1].first;
    (begin._M_current)->second = _Var12._M_current[-1].second;
    _Var12._M_current[-1].first = local_90.first;
    _Var12._M_current[-1].second = local_90.second;
    uVar13 = (long)_Var9._M_current - (long)begin._M_current >> 3;
    uVar6 = (long)end._M_current - (long)_Var12._M_current >> 3;
    if (((long)uVar13 < (long)((ulong)__len >> 3)) || ((long)uVar6 < (long)((ulong)__len >> 3))) {
      local_7c = local_7c + -1;
      if (local_7c == 0) {
        uVar6 = __len - 2U >> 1;
        do {
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>>
                    (begin,uVar6,__len,begin._M_current[uVar6],_Var10);
          bVar4 = uVar6 != 0;
          uVar6 = uVar6 - 1;
          lVar5 = local_40;
        } while (bVar4);
        while (_Var8._M_current = local_60._M_current, 8 < lVar5) {
          (local_60._M_current)->first = (begin._M_current)->first;
          (local_60._M_current)->second = (begin._M_current)->second;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,long,std::pair<int,int>,__gnu_cxx::__ops::_Iter_comp_iter<presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>>
                    (begin,0,lVar5 + -8 >> 3,*local_60._M_current,__cmp);
          local_60._M_current = _Var8._M_current + -1;
          lVar5 = lVar5 + -8;
        }
        return;
      }
      if (0x17 < (long)uVar13) {
        uVar7 = uVar13 >> 2;
        pVar2 = *begin._M_current;
        *begin._M_current = begin._M_current[uVar7];
        begin._M_current[uVar7] = pVar2;
        pVar2 = _Var12._M_current[-2];
        _Var12._M_current[-2] = _Var12._M_current[-1 - uVar7];
        _Var12._M_current[-1 - uVar7] = pVar2;
        if (0x80 < uVar13) {
          pVar2 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar7 + 1];
          begin._M_current[uVar7 + 1] = pVar2;
          pVar2 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar7 + 2];
          begin._M_current[uVar7 + 2] = pVar2;
          pVar2 = _Var12._M_current[-3];
          _Var12._M_current[-3] = _Var12._M_current[~uVar7 - 1];
          _Var12._M_current[~uVar7 - 1] = pVar2;
          pVar2 = _Var12._M_current[-4];
          _Var12._M_current[-4] = _Var12._M_current[-uVar7 + -3];
          _Var12._M_current[-uVar7 + -3] = pVar2;
        }
      }
      if (0x17 < (long)uVar6) {
        uVar13 = uVar6 >> 2;
        pVar2 = *_Var12._M_current;
        *_Var12._M_current = _Var12._M_current[uVar13];
        _Var12._M_current[uVar13] = pVar2;
        pVar2 = end._M_current[-1];
        end._M_current[-1] = end._M_current[-uVar13];
        end._M_current[-uVar13] = pVar2;
        if (0x80 < uVar6) {
          pVar2 = _Var12._M_current[1];
          _Var12._M_current[1] = _Var12._M_current[uVar13 + 1];
          _Var12._M_current[uVar13 + 1] = pVar2;
          pVar2 = _Var12._M_current[2];
          _Var12._M_current[2] = _Var12._M_current[uVar13 + 2];
          _Var12._M_current[uVar13 + 2] = pVar2;
          pVar2 = end._M_current[-2];
          end._M_current[-2] = end._M_current[~uVar13];
          end._M_current[~uVar13] = pVar2;
          pVar2 = end._M_current[-3];
          end._M_current[-3] = end._M_current[-2 - uVar13];
          end._M_current[-2 - uVar13] = pVar2;
        }
      }
    }
    else if (((ppVar11 <= _Var8._M_current) &&
             (bVar4 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                                (begin,_Var9,__cmp._M_comp.this), bVar4)) &&
            (bVar4 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
                               (_Var12,end,_Var10._M_comp.this), bVar4)) {
      return;
    }
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1,false>
              (begin,_Var9,__cmp._M_comp.this,local_7c,(bool)(leftmost & 1));
    leftmost = false;
    begin._M_current = _Var12._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }